

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double Cudd_Density(DdManager *dd,DdNode *f,int nvars)

{
  int iVar1;
  double density;
  int nodes;
  double minterms;
  int nvars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  minterms._4_4_ = nvars;
  if (nvars == 0) {
    minterms._4_4_ = dd->size;
  }
  dd_local = (DdManager *)Cudd_CountMinterm(dd,f,minterms._4_4_);
  if (((double)dd_local != -1.0) || (NAN((double)dd_local))) {
    iVar1 = Cudd_DagSize(f);
    dd_local = (DdManager *)((double)dd_local / (double)iVar1);
  }
  return (double)dd_local;
}

Assistant:

double
Cudd_Density(
  DdManager * dd /* manager */,
  DdNode * f /* function whose density is sought */,
  int  nvars /* size of the support of f */)
{
    double minterms;
    int nodes;
    double density;

    if (nvars == 0) nvars = dd->size;
    minterms = Cudd_CountMinterm(dd,f,nvars);
    if (minterms == (double) CUDD_OUT_OF_MEM) return(minterms);
    nodes = Cudd_DagSize(f);
    density = minterms / (double) nodes;
    return(density);

}